

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O3

void installMethodsInClass
               (Class cls,SparseArray *methods_to_replace,SparseArray *methods,BOOL replaceExisting)

{
  BOOL BVar1;
  uint in_EAX;
  _InitializingDtable *p_Var2;
  objc_method *method;
  undefined8 in_R8;
  dtable_t pSVar3;
  dtable_t dtable;
  uint32_t idx;
  undefined8 uStack_38;
  
  pSVar3 = uninstalled_dtable;
  dtable = (dtable_t)cls->dtable;
  uStack_38._0_4_ = in_EAX;
  if (uninstalled_dtable == (dtable_t)cls->dtable) {
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    dtable = (dtable_t)cls->dtable;
    p_Var2 = temporary_dtables;
    if (uninstalled_dtable == dtable) {
      for (; p_Var2 != (InitializingDtable *)0x0; p_Var2 = p_Var2->next) {
        if (p_Var2->class == cls) {
          pSVar3 = p_Var2->dtable;
          break;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      dtable = pSVar3;
      if (pSVar3 != uninstalled_dtable) {
        objc_sync_enter((id_conflict)cls);
        objc_sync_exit((id_conflict)cls);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
    }
  }
  if (uninstalled_dtable == dtable) {
    __assert_fail("uninstalled_dtable != dtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                  0x1a6,"void installMethodsInClass(Class, SparseArray *, SparseArray *, BOOL)");
  }
  uStack_38 = (ulong)(uint)uStack_38;
  method = (objc_method *)SparseArrayNext(methods,(uint32_t *)((long)&uStack_38 + 4));
  if (method != (objc_method *)0x0) {
    do {
      if (methods_to_replace != (SparseArray *)0x0) {
        (*(code *)(&DAT_0011f5a0 +
                  *(int *)(&DAT_0011f5a0 +
                          (ulong)(methods_to_replace->shift << 0x1d | methods_to_replace->shift >> 3
                                 ) * 4)))
                  (methods_to_replace,methods_to_replace,methods_to_replace,
                   (method->selector->field_0).name,
                   &DAT_0011f5a0 +
                   *(int *)(&DAT_0011f5a0 +
                           (ulong)(methods_to_replace->shift << 0x1d |
                                  methods_to_replace->shift >> 3) * 4));
        return;
      }
      BVar1 = installMethodInDtable(cls,dtable,method,(objc_method *)0x0,(BOOL)in_R8);
      if (BVar1 == '\0') {
        SparseArrayInsert(methods,uStack_38._4_4_,(void *)0x0);
      }
      method = (objc_method *)SparseArrayNext(methods,(uint32_t *)((long)&uStack_38 + 4));
    } while (method != (objc_method *)0x0);
  }
  return;
}

Assistant:

static void installMethodsInClass(Class cls,
                                  SparseArray *methods_to_replace,
                                  SparseArray *methods,
                                  BOOL replaceExisting)
{
	SparseArray *dtable = dtable_for_class(cls);
	assert(uninstalled_dtable != dtable);

	uint32_t idx = 0;
	struct objc_method *m;
	while ((m = SparseArrayNext(methods, &idx)))
	{
		struct objc_method *method_to_replace = methods_to_replace
			?  SparseArrayLookup(methods_to_replace, m->selector->index)
			: NULL;
		if (!installMethodInDtable(cls, dtable, m, method_to_replace, replaceExisting))
		{
			// Remove this method from the list, if it wasn't actually installed
			SparseArrayInsert(methods, idx, 0);
		}
	}
}